

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O2

_Bool compare_want_contents(Constraint *constraint,CgreenValue actual)

{
  int iVar1;
  _Bool _Var2;
  
  if (actual.value.integer_value == 0) {
    _Var2 = false;
  }
  else {
    iVar1 = bcmp((constraint->expected_value).value.pointer_value,actual.value.pointer_value,
                 constraint->size_of_expected_value);
    _Var2 = iVar1 == 0;
  }
  return _Var2;
}

Assistant:

bool compare_want_contents(Constraint *constraint, CgreenValue actual) {
    /* We can't inspect the contents of a NULL pointer, so comparison always fails */
    /* TODO: This should really be .pointer_value */
    if ((void *)actual.value.integer_value == NULL) {
        return 0;
    }

    return 0 == memcmp(constraint->expected_value.value.pointer_value,
                       (void *)actual.value.integer_value, constraint->size_of_expected_value);
}